

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ublox.h
# Opt level: O1

int SetBaseCfgublox(UBLOX *publox)

{
  double dVar1;
  double dVar2;
  ushort uVar3;
  int i_16;
  int iVar4;
  ssize_t sVar5;
  uchar CK_B;
  int iVar6;
  int i;
  long lVar7;
  uchar CK_A;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  double dVar11;
  uchar sendbuf [512];
  char local_2a8 [8];
  ushort uStack_2a0;
  undefined1 uStack_29e;
  undefined1 uStack_29d;
  undefined1 uStack_29c;
  undefined1 uStack_29b;
  char cStack_29a;
  char cStack_299;
  undefined1 uStack_298;
  undefined1 uStack_297;
  undefined4 uStack_296;
  undefined1 uStack_292;
  undefined1 uStack_291;
  byte bStack_290;
  undefined1 uStack_28f;
  undefined1 uStack_28e;
  undefined1 uStack_28d;
  undefined2 uStack_28c;
  undefined2 uStack_28a;
  undefined2 uStack_288;
  undefined4 local_286;
  undefined2 local_282;
  undefined4 uStack_280;
  undefined2 uStack_27c;
  char local_27a;
  char local_279;
  undefined8 local_228;
  undefined4 local_220;
  undefined2 local_21c;
  char local_21a;
  char local_219;
  undefined8 local_218;
  undefined4 local_210;
  undefined2 local_20c;
  char local_20a;
  char local_209;
  undefined8 local_208;
  undefined4 local_200;
  undefined2 local_1fc;
  char local_1fa;
  char local_1f9;
  undefined8 local_1f8;
  undefined4 local_1f0;
  undefined2 local_1ec;
  char local_1ea;
  char local_1e9;
  undefined8 local_1e8;
  undefined4 local_1e0;
  undefined2 local_1dc;
  char local_1da;
  char local_1d9;
  undefined8 local_1d8;
  undefined4 local_1d0;
  undefined2 local_1cc;
  char local_1ca;
  char local_1c9;
  undefined8 local_1c8;
  undefined4 local_1c0;
  undefined2 local_1bc;
  char local_1ba;
  char local_1b9;
  undefined8 local_1b8;
  undefined4 local_1b0;
  undefined2 local_1ac;
  char local_1aa;
  char local_1a9;
  undefined8 local_1a8;
  undefined4 local_1a0;
  undefined2 local_19c;
  char local_19a;
  char local_199;
  undefined8 local_198;
  undefined4 local_190;
  undefined2 local_18c;
  char local_18a;
  char local_189;
  undefined8 local_188;
  undefined4 local_180;
  undefined2 local_17c;
  char local_17a;
  char local_179;
  undefined8 local_178;
  undefined4 local_170;
  undefined2 local_16c;
  char local_16a;
  char local_169;
  undefined8 local_168;
  undefined4 local_160;
  undefined2 local_15c;
  char local_15a;
  char local_159;
  undefined8 local_158;
  undefined4 local_150;
  undefined2 local_14c;
  char local_14a;
  char local_149;
  undefined8 local_148;
  undefined4 local_140;
  undefined2 local_13c;
  char local_13a;
  char local_139;
  undefined8 local_138;
  undefined4 local_130;
  undefined2 local_12c;
  char local_12a;
  char local_129;
  undefined8 local_128;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined4 local_114;
  undefined2 local_110;
  char local_10e;
  char local_10d;
  undefined8 local_10c;
  ulong uStack_104;
  undefined8 local_fc;
  undefined8 uStack_f4;
  ulong local_ec;
  undefined4 local_e4;
  undefined2 local_e0;
  char local_de;
  char local_dd;
  
  local_2a8[4] = '\b';
  local_2a8[5] = '\0';
  local_2a8[6] = 0xf5;
  local_2a8[7] = 5;
  uStack_2a0 = 0x100;
  uStack_29e = 0;
  uStack_29d = 1;
  uStack_29c = 0;
  uStack_29b = 0;
  lVar7 = 2;
  local_219 = '\0';
  local_21a = '\0';
  do {
    local_21a = local_21a + local_2a8[lVar7];
    local_219 = local_219 + local_21a;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0xe);
  cStack_29a = local_21a;
  cStack_299 = local_219;
  local_228 = 0x5f50008010662b5;
  local_220 = 0x1000100;
  local_21c = 0;
  local_2a8[4] = '\b';
  local_2a8[5] = '\0';
  local_2a8[6] = 0xf5;
  local_2a8[7] = 0x4d;
  uStack_2a0 = 0x100;
  uStack_29e = 0;
  uStack_29d = 1;
  uStack_29c = 0;
  uStack_29b = 0;
  lVar7 = 2;
  local_209 = '\0';
  local_20a = '\0';
  do {
    local_20a = local_20a + local_2a8[lVar7];
    local_209 = local_209 + local_20a;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0xe);
  cStack_29a = local_20a;
  cStack_299 = local_209;
  local_218 = 0x4df50008010662b5;
  local_210 = 0x1000100;
  local_20c = 0;
  local_2a8[4] = '\b';
  local_2a8[5] = '\0';
  local_2a8[6] = 0xf5;
  local_2a8[7] = 0x57;
  uStack_2a0 = 0x100;
  uStack_29e = 0;
  uStack_29d = 1;
  uStack_29c = 0;
  uStack_29b = 0;
  lVar7 = 2;
  local_1f9 = '\0';
  local_1fa = '\0';
  do {
    local_1fa = local_1fa + local_2a8[lVar7];
    local_1f9 = local_1f9 + local_1fa;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0xe);
  cStack_29a = local_1fa;
  cStack_299 = local_1f9;
  local_208 = 0x57f50008010662b5;
  local_200 = 0x1000100;
  local_1fc = 0;
  local_2a8[4] = '\b';
  local_2a8[5] = '\0';
  local_2a8[6] = 0xf5;
  local_2a8[7] = 0x61;
  uStack_2a0 = 0x100;
  uStack_29e = 0;
  uStack_29d = 1;
  uStack_29c = 0;
  uStack_29b = 0;
  lVar7 = 2;
  local_1e9 = '\0';
  local_1ea = '\0';
  do {
    local_1ea = local_1ea + local_2a8[lVar7];
    local_1e9 = local_1e9 + local_1ea;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0xe);
  cStack_29a = local_1ea;
  cStack_299 = local_1e9;
  local_1f8 = 0x61f50008010662b5;
  local_1f0 = 0x1000100;
  local_1ec = 0;
  local_2a8[4] = '\b';
  local_2a8[5] = '\0';
  local_2a8[6] = 0xf5;
  local_2a8[7] = 0x7f;
  uStack_2a0 = 0x100;
  uStack_29e = 0;
  uStack_29d = 1;
  uStack_29c = 0;
  uStack_29b = 0;
  lVar7 = 2;
  local_1d9 = '\0';
  local_1da = '\0';
  do {
    local_1da = local_1da + local_2a8[lVar7];
    local_1d9 = local_1d9 + local_1da;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0xe);
  cStack_29a = local_1da;
  cStack_299 = local_1d9;
  local_1e8 = 0x7ff50008010662b5;
  local_1e0 = 0x1000100;
  local_1dc = 0;
  local_2a8[4] = '\b';
  local_2a8[5] = '\0';
  local_2a8[6] = 0xf5;
  local_2a8[7] = 0xe6;
  uStack_2a0 = 0x100;
  uStack_29e = 0;
  uStack_29d = 1;
  uStack_29c = 0;
  uStack_29b = 0;
  lVar7 = 2;
  local_1c9 = '\0';
  local_1ca = '\0';
  do {
    local_1ca = local_1ca + local_2a8[lVar7];
    local_1c9 = local_1c9 + local_1ca;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0xe);
  cStack_29a = local_1ca;
  cStack_299 = local_1c9;
  local_1d8 = 0xe6f50008010662b5;
  local_1d0 = 0x1000100;
  local_1cc = 0;
  local_2a8[4] = '\b';
  local_2a8[5] = '\0';
  local_2a8[6] = 0xf5;
  local_2a8[7] = 0xfe;
  uStack_2a0 = 0x100;
  uStack_29e = 0;
  uStack_29d = 1;
  uStack_29c = 0;
  uStack_29b = 0;
  lVar7 = 2;
  local_1b9 = '\0';
  local_1ba = '\0';
  do {
    local_1ba = local_1ba + local_2a8[lVar7];
    local_1b9 = local_1b9 + local_1ba;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0xe);
  cStack_29a = local_1ba;
  cStack_299 = local_1b9;
  local_1c8 = 0xfef50008010662b5;
  local_1c0 = 0x1000100;
  local_1bc = 0;
  local_2a8[4] = '\b';
  local_2a8[5] = '\0';
  local_2a8[6] = 0xf0;
  local_1a9 = '\0';
  uStack_29d = 0;
  uStack_29c = 0;
  uStack_29b = 0;
  local_2a8[7] = 0;
  uStack_2a0 = 0;
  uStack_29e = 0;
  lVar7 = 2;
  local_1aa = '\0';
  do {
    local_1aa = local_1aa + local_2a8[lVar7];
    local_1a9 = local_1a9 + local_1aa;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0xe);
  cStack_29a = local_1aa;
  cStack_299 = local_1a9;
  local_1b8 = 0xf00008010662b5;
  local_1b0 = 0;
  local_1ac = 0;
  local_2a8[4] = '\b';
  local_2a8[5] = '\0';
  local_2a8[6] = 0xf0;
  local_2a8[7] = 1;
  uStack_29c = 0;
  uStack_29b = 0;
  uStack_2a0 = 0;
  uStack_29e = 0;
  uStack_29d = 0;
  lVar7 = 2;
  local_199 = '\0';
  local_19a = '\0';
  do {
    local_19a = local_19a + local_2a8[lVar7];
    local_199 = local_199 + local_19a;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0xe);
  cStack_29a = local_19a;
  cStack_299 = local_199;
  local_1a8 = 0x1f00008010662b5;
  local_1a0 = 0;
  local_19c = 0;
  local_2a8[4] = '\b';
  local_2a8[5] = '\0';
  local_2a8[6] = 0xf0;
  local_2a8[7] = 2;
  uStack_29c = 0;
  uStack_29b = 0;
  uStack_2a0 = 0;
  uStack_29e = 0;
  uStack_29d = 0;
  lVar7 = 2;
  local_189 = '\0';
  local_18a = '\0';
  do {
    local_18a = local_18a + local_2a8[lVar7];
    local_189 = local_189 + local_18a;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0xe);
  cStack_29a = local_18a;
  cStack_299 = local_189;
  local_198 = 0x2f00008010662b5;
  local_190 = 0;
  local_18c = 0;
  local_2a8[4] = '\b';
  local_2a8[5] = '\0';
  local_2a8[6] = 0xf0;
  local_2a8[7] = 3;
  uStack_29c = 0;
  uStack_29b = 0;
  uStack_2a0 = 0;
  uStack_29e = 0;
  uStack_29d = 0;
  lVar7 = 2;
  local_179 = '\0';
  local_17a = '\0';
  do {
    local_17a = local_17a + local_2a8[lVar7];
    local_179 = local_179 + local_17a;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0xe);
  cStack_29a = local_17a;
  cStack_299 = local_179;
  local_188 = 0x3f00008010662b5;
  local_180 = 0;
  local_17c = 0;
  local_2a8[4] = '\b';
  local_2a8[5] = '\0';
  local_2a8[6] = 0xf0;
  local_2a8[7] = 4;
  uStack_29c = 0;
  uStack_29b = 0;
  uStack_2a0 = 0;
  uStack_29e = 0;
  uStack_29d = 0;
  lVar7 = 2;
  local_169 = '\0';
  local_16a = '\0';
  do {
    local_16a = local_16a + local_2a8[lVar7];
    local_169 = local_169 + local_16a;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0xe);
  cStack_29a = local_16a;
  cStack_299 = local_169;
  local_178 = 0x4f00008010662b5;
  local_170 = 0;
  local_16c = 0;
  local_2a8[4] = '\b';
  local_2a8[5] = '\0';
  local_2a8[6] = 0xf0;
  local_2a8[7] = 5;
  uStack_29c = 0;
  uStack_29b = 0;
  uStack_2a0 = 0;
  uStack_29e = 0;
  uStack_29d = 0;
  lVar7 = 2;
  local_159 = '\0';
  local_15a = '\0';
  do {
    local_15a = local_15a + local_2a8[lVar7];
    local_159 = local_159 + local_15a;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0xe);
  cStack_29a = local_15a;
  cStack_299 = local_159;
  local_168 = 0x5f00008010662b5;
  local_160 = 0;
  local_15c = 0;
  local_2a8[4] = '\b';
  local_2a8[5] = '\0';
  local_2a8[6] = 0xf0;
  local_2a8[7] = 7;
  uStack_29c = 0;
  uStack_29b = 0;
  uStack_2a0 = 0;
  uStack_29e = 0;
  uStack_29d = 0;
  lVar7 = 2;
  local_149 = '\0';
  local_14a = '\0';
  do {
    local_14a = local_14a + local_2a8[lVar7];
    local_149 = local_149 + local_14a;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0xe);
  cStack_29a = local_14a;
  cStack_299 = local_149;
  local_158 = 0x7f00008010662b5;
  local_150 = 0;
  local_14c = 0;
  local_2a8[4] = '\b';
  local_2a8[5] = '\0';
  local_2a8[6] = 0xf0;
  local_2a8[7] = 8;
  uStack_29c = 0;
  uStack_29b = 0;
  uStack_2a0 = 0;
  uStack_29e = 0;
  uStack_29d = 0;
  lVar7 = 2;
  local_139 = '\0';
  local_13a = '\0';
  do {
    local_13a = local_13a + local_2a8[lVar7];
    local_139 = local_139 + local_13a;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0xe);
  cStack_29a = local_13a;
  cStack_299 = local_139;
  local_148 = 0x8f00008010662b5;
  local_140 = 0;
  local_13c = 0;
  local_2a8[4] = '\b';
  local_2a8[5] = '\0';
  local_2a8[6] = 0xf0;
  local_2a8[7] = 0xd;
  uStack_29c = 0;
  uStack_29b = 0;
  uStack_2a0 = 0;
  uStack_29e = 0;
  uStack_29d = 0;
  lVar7 = 2;
  local_129 = '\0';
  local_12a = '\0';
  do {
    local_12a = local_12a + local_2a8[lVar7];
    local_129 = local_129 + local_12a;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0xe);
  local_138 = 0xdf00008010662b5;
  local_130 = 0;
  local_12c = 0;
  local_10d = '\0';
  cStack_29a = 0;
  cStack_299 = 0;
  uStack_298 = 0;
  uStack_29e = 0;
  uStack_29d = 0;
  uStack_29c = 0;
  uStack_29b = 0;
  local_2a8[4] = '\x14';
  local_2a8[5] = '\0';
  local_2a8[6] = 0;
  local_2a8[7] = 0x23;
  uStack_2a0 = 0xa00;
  uStack_297 = 1;
  uStack_296._0_2_ = 0;
  uStack_296._2_2_ = 0;
  uStack_292 = 0;
  uStack_291 = 0;
  bStack_290 = 0;
  uStack_28f = 0;
  lVar7 = 2;
  local_10e = '\0';
  do {
    local_10e = local_10e + local_2a8[lVar7];
    local_10d = local_10d + local_10e;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x1a);
  local_128 = 0x23000014170662b5;
  uStack_120 = 0xa00;
  uStack_11c = 0;
  uStack_118 = 0x100;
  local_114 = 0;
  local_110 = 0;
  dVar2 = publox->fixedLat * 10000000.0;
  iVar4 = (int)dVar2;
  dVar1 = publox->fixedLon * 10000000.0;
  iVar6 = (int)dVar1;
  dVar11 = publox->fixedAlt * 100.0;
  iVar8 = (int)dVar11;
  lVar7 = (long)(publox->fixedPosAcc * 10000.0);
  uVar3 = (ushort)(byte)publox->SurveyMode;
  local_2a8[0] = -0x4b;
  local_2a8[1] = 'b';
  local_2a8[2] = '\x06';
  local_2a8[3] = 'q';
  local_2a8[4] = '(';
  local_2a8[5] = '\0';
  local_2a8[6] = 0;
  local_2a8[7] = 0;
  uStack_2a0 = uVar3 | 0x100;
  uStack_29e = (undefined1)iVar4;
  uStack_29d = (undefined1)((uint)iVar4 >> 8);
  uStack_29c = (undefined1)((uint)iVar4 >> 0x10);
  uStack_29b = (undefined1)((uint)iVar4 >> 0x18);
  cStack_29a = (char)iVar6;
  cStack_299 = (char)((uint)iVar6 >> 8);
  uStack_298 = (undefined1)((uint)iVar6 >> 0x10);
  uStack_297 = (undefined1)((uint)iVar6 >> 0x18);
  uStack_296._0_2_ = (undefined2)iVar8;
  uStack_296._2_2_ = (undefined2)((uint)iVar8 >> 0x10);
  uStack_292 = (undefined1)(int)((dVar2 - (double)(int)dVar2) * 100.0);
  uStack_291 = (undefined1)(int)((dVar1 - (double)(int)dVar1) * 100.0);
  bStack_290 = (byte)(int)((dVar11 - (double)(int)dVar11) * 100.0);
  uStack_28f = 0;
  uStack_28e = (undefined1)lVar7;
  uStack_28d = (undefined1)((ulong)lVar7 >> 8);
  uStack_28c = (undefined2)((ulong)lVar7 >> 0x10);
  uStack_28a = (undefined2)(long)publox->svinMinDur;
  uStack_288 = (undefined2)((ulong)(long)publox->svinMinDur >> 0x10);
  local_286 = (undefined4)(long)(publox->svinAccLimit * 10000.0);
  local_282 = 0;
  uStack_280 = 0;
  uStack_27c = 0;
  lVar7 = 2;
  local_279 = '\0';
  local_27a = '\0';
  do {
    local_27a = local_27a + local_2a8[lVar7];
    local_279 = local_279 + local_27a;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0x2e);
  local_10c = 0x28710662b5;
  uStack_104 = CONCAT17(cStack_299,
                        CONCAT16(cStack_29a,
                                 CONCAT15(uStack_29b,
                                          CONCAT14(uStack_29c,
                                                   CONCAT13(uStack_29d,CONCAT12(uStack_29e,uVar3))))
                                )) | 0x100;
  local_fc = CONCAT17(uStack_291,
                      CONCAT16(uStack_292,
                               CONCAT24(uStack_296._2_2_,
                                        CONCAT22((undefined2)uStack_296,(short)((uint)iVar6 >> 0x10)
                                                ))));
  uStack_f4 = CONCAT26(uStack_28a,
                       CONCAT24(uStack_28c,
                                CONCAT13(uStack_28d,CONCAT12(uStack_28e,(ushort)bStack_290))));
  local_ec = (ulong)CONCAT42(local_286,uStack_288);
  local_e4 = 0;
  local_e0 = 0;
  iVar4 = (publox->RS232Port).DevType;
  local_de = local_27a;
  local_dd = local_279;
  uStack_296 = iVar8;
  if (iVar4 - 1U < 4) {
    iVar4 = (publox->RS232Port).s;
    uVar10 = 0;
    do {
      sVar5 = send(iVar4,(void *)((long)&local_228 + uVar10),(long)(0x14c - (int)uVar10),0);
      if ((int)sVar5 < 1) goto LAB_0012b94b;
      uVar9 = (int)uVar10 + (int)sVar5;
      uVar10 = (ulong)uVar9;
    } while ((int)uVar9 < 0x14c);
  }
  else {
    if (iVar4 != 0) {
LAB_0012b94b:
      puts("Error writing data to a ublox. ");
      return 1;
    }
    iVar4 = *(int *)&(publox->RS232Port).hDev;
    uVar10 = 0;
    do {
      sVar5 = write(iVar4,(void *)((long)&local_228 + uVar10),(ulong)(0x14c - (int)uVar10));
      if ((int)sVar5 < 1) goto LAB_0012b94b;
      uVar9 = (int)uVar10 + (int)sVar5;
      uVar10 = (ulong)uVar9;
    } while (uVar9 < 0x14c);
  }
  if ((publox->bSaveRawData != 0) && ((FILE *)publox->pfSaveFile != (FILE *)0x0)) {
    fwrite(&local_228,0x14c,1,(FILE *)publox->pfSaveFile);
    fflush((FILE *)publox->pfSaveFile);
  }
  return 0;
}

Assistant:

inline int SetBaseCfgublox(UBLOX* publox)
{
	unsigned char sendbuf[512];
	int sendbuflen = 0;
	int offset = 0;
	unsigned char packet[128];
	int packetlen = 0;
	unsigned char cfg_msg_pl[8];
	struct CFG_NMEA_PL_UBX cfg_nmea_pl;
	struct CFG_TMODE3_PL_UBX cfg_tmode3_pl;

	// Enable 1005, 1077, 1087, 1127 RTCM messages on UART1 and USB.
	memset(cfg_msg_pl, 0, sizeof(cfg_msg_pl));
	cfg_msg_pl[0] = RTCM_CLASS_UBX;
	cfg_msg_pl[1] = RTCM_1005_ID_UBX;
	cfg_msg_pl[3] = 1; // UART1 rate.
	cfg_msg_pl[5] = 1; // USB rate.
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	cfg_msg_pl[1] = RTCM_1077_ID_UBX;
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	cfg_msg_pl[1] = RTCM_1087_ID_UBX;
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	cfg_msg_pl[1] = RTCM_1097_ID_UBX; // Not available for M8P...
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	cfg_msg_pl[1] = RTCM_1127_ID_UBX;
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	cfg_msg_pl[1] = RTCM_1230_ID_UBX; // Not available for M8P...
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	cfg_msg_pl[1] = RTCM_4072_0_ID_UBX; // For moving base, not available for M8P...
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	// Disable GGA, GLL, GSA, GSV, RMC, VTG, GST, ZDA, GNS NMEA messages.
	memset(cfg_msg_pl, 0, sizeof(cfg_msg_pl));
	cfg_msg_pl[0] = NMEA_STD_CLASS_UBX;
	cfg_msg_pl[1] = NMEA_STD_GGA_ID_UBX;
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	cfg_msg_pl[1] = NMEA_STD_GLL_ID_UBX;
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	cfg_msg_pl[1] = NMEA_STD_GSA_ID_UBX;
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	cfg_msg_pl[1] = NMEA_STD_GSV_ID_UBX;
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	cfg_msg_pl[1] = NMEA_STD_RMC_ID_UBX;
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	cfg_msg_pl[1] = NMEA_STD_VTG_ID_UBX;
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	cfg_msg_pl[1] = NMEA_STD_GST_ID_UBX;
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	cfg_msg_pl[1] = NMEA_STD_ZDA_ID_UBX;
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	cfg_msg_pl[1] = NMEA_STD_GNS_ID_UBX;
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	//cfg_msg_pl[1] = NMEA_STD_TXT_ID_UBX;
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, LEN_CFG_MSG_PL_UBX);
	////EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_MSG_ID_UBX, (unsigned char*)&cfg_msg_pl, sizeof(cfg_msg_pl));
	//memcpy(sendbuf+offset, packet, packetlen);
	//offset += packetlen;

	// Set NMEA high precision mode.
	memset(&cfg_nmea_pl, 0, sizeof(cfg_nmea_pl));
	cfg_nmea_pl.nmeaVersion = NMEA_VERSION_2_3_UBX;
	cfg_nmea_pl.flags.consider = 1;
	cfg_nmea_pl.flags.highPrec = 1;
	cfg_nmea_pl.version = 1;
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_NMEA_ID_UBX, (unsigned char*)&cfg_nmea_pl, LEN_CFG_NMEA_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_NMEA_ID_UBX, (unsigned char*)&cfg_nmea_pl, sizeof(cfg_nmea_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;

	//UBX-CFG-PORT set RTCM 3 as Output Protocol...

	// Activate Self-Survey-In or Fixed-Position-Mode.
	memset(&cfg_tmode3_pl, 0, sizeof(cfg_tmode3_pl));
	cfg_tmode3_pl.flags.lla = 1;
	cfg_tmode3_pl.flags.mode = (unsigned short)publox->SurveyMode;
	cfg_tmode3_pl.ecefXOrLat = (int)(publox->fixedLat*10000000);
	cfg_tmode3_pl.ecefYOrLon = (int)(publox->fixedLon*10000000);
	cfg_tmode3_pl.ecefZOrAlt = (int)(publox->fixedAlt*100);
	cfg_tmode3_pl.ecefXOrLatHP = (char)((publox->fixedLat*10000000-cfg_tmode3_pl.ecefXOrLat)*100);
	cfg_tmode3_pl.ecefYOrLonHP = (char)((publox->fixedLon*10000000-cfg_tmode3_pl.ecefYOrLon)*100);
	cfg_tmode3_pl.ecefZOrAltHP = (char)((publox->fixedAlt*100-cfg_tmode3_pl.ecefZOrAlt)*100);
	cfg_tmode3_pl.fixedPosAcc = (unsigned int)(publox->fixedPosAcc*10000);
	cfg_tmode3_pl.svinMinDur = (unsigned int)publox->svinMinDur;
	cfg_tmode3_pl.svinAccLimit = (unsigned int)(publox->svinAccLimit*10000);
	EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_TMODE3_ID_UBX, (unsigned char*)&cfg_tmode3_pl, LEN_CFG_TMODE3_PL_UBX);
	//EncodePacketUBX(packet, &packetlen, CFG_CLASS_UBX, CFG_TMODE3_ID_UBX, (unsigned char*)&cfg_tmode3_pl, sizeof(cfg_tmode3_pl));
	memcpy(sendbuf+offset, packet, packetlen);
	offset += packetlen;
	
	sendbuflen = offset;

	if (WriteAllRS232Port(&publox->RS232Port, sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		printf("Error writing data to a ublox. \n");
		return EXIT_FAILURE;
	}
	if ((publox->bSaveRawData)&&(publox->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, publox->pfSaveFile);
		fflush(publox->pfSaveFile);
	}

	// Should check ACK...

	return EXIT_SUCCESS;
}